

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O2

bool __thiscall
pg::PTLSolver::search_rec(PTLSolver *this,bitset *Region,int vtop,int player,bitset *Subgame)

{
  string *psVar1;
  uint __val;
  uint uVar2;
  byte bVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  size_t sVar11;
  Game *pGVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  bitset local_138;
  ulong local_118;
  long local_110;
  ulong local_108;
  undefined8 local_100;
  bitset local_f8;
  long local_d8;
  ulong local_d0;
  string px;
  bitset Lower;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bitset::bitset(&local_f8,Region);
  bitset::bitset(&local_138,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&Lower,Subgame);
  uVar13 = (ulong)vtop;
  local_d0 = uVar13 >> 6;
  bVar3 = (byte)vtop & 0x3f;
  uVar15 = -2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3;
  local_100 = 0;
  local_f8._bits[local_d0] = local_f8._bits[local_d0] & uVar15;
  psVar1 = &this->path;
  local_108 = uVar13;
  do {
    lVar17 = 0;
    do {
      if (local_108 + lVar17 == 0) {
        bitset::~bitset(&Lower);
        bitset::~bitset(&local_138);
        bitset::~bitset(&local_f8);
        return (bool)((byte)local_100 & 1);
      }
      uVar16 = lVar17 + -1 + local_108;
      lVar17 = lVar17 + -1;
      uVar18 = uVar16 >> 6;
    } while ((local_f8._bits[uVar18] >> (uVar16 & 0x3f) & 1) == 0);
    local_118 = 1L << (uVar16 & 0x3f);
    __val = ((this->super_Solver).game)->_priority[local_108 + lVar17];
    local_110 = lVar17;
    if ((__val & 1) == player) {
      local_138._bits[uVar18] = local_138._bits[uVar18] | local_118;
      this->str[local_108 + lVar17] = -1;
      iVar9 = (this->Q).pointer;
      (this->Q).pointer = iVar9 + 1;
      local_118 = local_108 + lVar17;
      (this->Q).queue[iVar9] = (uint)local_118;
      local_d8 = local_108 * 4;
      while( true ) {
        iVar9 = (this->Q).pointer;
        if ((long)iVar9 == 0) break;
        (this->Q).pointer = iVar9 + -1;
        uVar2 = (this->Q).queue[(long)iVar9 + -1];
        attractVertices(this,player,uVar2,&local_f8,&local_138,&Lower);
        attractTangles(this,player,uVar2,&local_f8,&local_138,&Lower);
      }
      if (1 < (this->super_Solver).trace) {
        poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
        poVar10 = std::operator<<(poVar10,(string *)psVar1);
        poVar10 = std::operator<<(poVar10,"-");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,__val);
        std::operator<<(poVar10,"\x1b[m");
        for (sVar11 = bitset::find_first(&local_138); poVar10 = (this->super_Solver).logger,
            sVar11 != 0xffffffffffffffff; sVar11 = bitset::find_next(&local_138,sVar11)) {
          poVar10 = std::operator<<(poVar10," \x1b[1;38;5;15m");
          px._M_dataplus._M_p = (pointer)(this->super_Solver).game;
          px._M_string_length._0_4_ = (int)sVar11;
          poVar10 = operator<<(poVar10,(_label_vertex *)&px);
          std::operator<<(poVar10,"\x1b[m");
          if (this->str[sVar11] != -1) {
            poVar10 = std::operator<<((this->super_Solver).logger,"->");
            px._M_dataplus._M_p = (pointer)(this->super_Solver).game;
            px._M_string_length._0_4_ = this->str[sVar11];
            operator<<(poVar10,(_label_vertex *)&px);
          }
        }
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      iVar9 = Solver::owner(&this->super_Solver,(int)local_118);
      if (iVar9 == player) {
        if (*(int *)((long)this->str + local_110 * 4 + local_d8) != -1) {
          pGVar12 = (this->super_Solver).game;
          goto LAB_00161b63;
        }
LAB_00161c01:
        std::__cxx11::string::string((string *)&px,(string *)psVar1);
        std::__cxx11::to_string(&local_70,__val);
        std::operator+(&local_50,"-",&local_70);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        bVar8 = search_rec(this,&local_138,(int)local_118,player,&Lower);
        std::__cxx11::string::_M_assign((string *)psVar1);
        std::__cxx11::string::~string((string *)&px);
      }
      else {
        pGVar12 = (this->super_Solver).game;
        for (piVar14 = pGVar12->_outedges +
                       *(int *)((long)pGVar12->_firstouts + local_110 * 4 + local_d8);
            uVar16 = (ulong)*piVar14, uVar16 != 0xffffffffffffffff; piVar14 = piVar14 + 1) {
          if (((local_138._bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) &&
             ((Lower._bits[uVar16 >> 6] & 1L << (uVar16 & 0x3f)) != 0)) goto LAB_00161c01;
        }
LAB_00161b63:
        memset(this->pea_vidx,0,pGVar12->n_vertices << 2);
        this->pea_curidx = 1;
        bVar8 = extractTangles(this,(int)local_118,&local_138,this->str);
      }
      bitset::operator-=(&local_f8,&local_138);
      bitset::operator-=(&Lower,&local_138);
      uVar16 = local_108;
    }
    else {
      local_f8._bits[uVar18] = ~local_118 & local_f8._bits[uVar18];
      local_138._bits[local_d0] = local_138._bits[local_d0] | 1L << (uVar13 & 0x3f);
      this->str[uVar13] = -1;
      iVar9 = (this->Q).pointer;
      (this->Q).pointer = iVar9 + 1;
      (this->Q).queue[iVar9] = vtop;
      while( true ) {
        sVar7 = local_f8._allocsize;
        sVar6 = local_f8._bitssize;
        sVar11 = local_f8._size;
        puVar5 = local_f8._bits;
        puVar4 = local_138._bits;
        iVar9 = (this->Q).pointer;
        if ((long)iVar9 == 0) break;
        (this->Q).pointer = iVar9 + -1;
        uVar2 = (this->Q).queue[(long)iVar9 + -1];
        attractVertices(this,player,uVar2,&local_f8,&local_138,&Lower);
        attractTangles(this,player,uVar2,&local_f8,&local_138,&Lower);
      }
      local_f8._size = local_138._size;
      local_f8._bitssize = local_138._bitssize;
      local_138._size = sVar11;
      local_138._bitssize = sVar6;
      local_f8._allocsize = local_138._allocsize;
      local_138._allocsize = sVar7;
      local_f8._bits = local_138._bits;
      local_138._bits = puVar5;
      puVar4[local_d0] = puVar4[local_d0] & uVar15;
      bitset::operator-=(&local_138,&local_f8);
      local_138._bits[uVar18] = local_138._bits[uVar18] | local_118;
      if (1 < (this->super_Solver).trace) {
        poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
        poVar10 = std::operator<<(poVar10,(string *)psVar1);
        poVar10 = std::operator<<(poVar10,"-");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,__val);
        std::operator<<(poVar10,"\x1b[m");
        for (sVar11 = bitset::find_last(&local_138); poVar10 = (this->super_Solver).logger,
            sVar11 != 0xffffffffffffffff; sVar11 = bitset::find_prev(&local_138,sVar11)) {
          poVar10 = std::operator<<(poVar10," \x1b[1;38;5;15m");
          px._M_dataplus._M_p = (pointer)(this->super_Solver).game;
          px._M_string_length._0_4_ = (int)sVar11;
          poVar10 = operator<<(poVar10,(_label_vertex *)&px);
          std::operator<<(poVar10,"\x1b[m");
          uVar16 = (ulong)this->str[sVar11];
          if ((uVar16 != 0xffffffffffffffff) &&
             ((local_138._bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)) {
            poVar10 = std::operator<<((this->super_Solver).logger,"->");
            px._M_dataplus._M_p = (pointer)(this->super_Solver).game;
            px._M_string_length._0_4_ = this->str[sVar11];
            operator<<(poVar10,(_label_vertex *)&px);
          }
        }
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      std::__cxx11::string::string((string *)&px,(string *)psVar1);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,"-",&local_70);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar16 = local_108;
      bVar8 = search_rec(this,&local_138,(int)local_108 + (int)local_110,player,&Lower);
      std::__cxx11::string::_M_assign((string *)psVar1);
      std::__cxx11::string::~string((string *)&px);
    }
    local_108 = uVar16 + local_110;
    for (lVar17 = 0; local_138._bitssize << 3 != lVar17; lVar17 = lVar17 + 8) {
      *(undefined8 *)((long)local_138._bits + lVar17) = 0;
    }
    local_100 = CONCAT71((int7)((ulong)local_100 >> 8),(byte)local_100 | bVar8);
  } while( true );
}

Assistant:

bool
PTLSolver::search_rec(bitset &Region, int vtop, int player, bitset &Subgame)
{
    bool changes = false; // whether we found tangles/dominions

    bitset Y(Region); // the remaining subgame of <R>
    bitset Z(nodecount()); // move me
    bitset Lower(Subgame);

#if 0 /**/
    // First, attract to the open "exit" for the opponent
    // That is, remove Attr(top) from <Y>.

    Z[vtop] = true; // add to <Z>
    str[vtop] = -1;
    Q.push(vtop);

    while (Q.nonempty()) {
        const int v = Q.pop();
        attractVertices(1-player, v, Y, Z, Y);
        if (multiplayer) attractTangles(1-player, v, Y, Z, Y);
    }

    Y -= Z;
    Z.reset();
#else
    Y[vtop] = false; // ensure <vtop> is never attracted...
    // Lower[vtop] = false; // and that 
#endif

    /////////////////
    // After each iteration:
    // <Y> and <Lower> are updated, removing subregions
    // if top is "good": attract to Z, remove from <Y> and <Lower>
    // if <Z> is a "bad" ... ..
    /////////////////

    for (int top=vtop-1; top!=-1; top--) {
        // find next top below <vtop> in Y
        if (!Y[top]) continue;

        /*
        logger << "Contents of Y:";
        for (auto v = Y.find_first(); v != bitset::npos; v = Y.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        logger << "Contents of Lower:";
        for (auto v = Lower.find_first(); v != bitset::npos; v = Lower.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        */

        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (pl == player) {
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            /**
             * Now Z is the lowest region, <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Lowest region, check if closed.
             */

            if (owner(top) == player) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and Lower[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

                std::string px = path;
                path += "-" + std::to_string(pr);
                changes |= search_rec(Z, top, player, Lower);
                path = px;
            }

            Y -= Z;
            Lower -= Z;
        } else {
            // Now recompute the region: reattract to <vtop>,
            // but not via higher (already removed) regions or via the bad vertex <top>

            // Y := remaining region except <top>
            // Lower := remaining region plus remaining lower game

            Y[top] = false; // remove <top> from consideration

            // logger << "Contents of Y2:";
            // for (auto v = Y2.find_first(); v != bitset::npos; v = Y2.find_next(v)) logger << " " << label_vertex(v);
            // logger << std::endl;

            Z[vtop] = true; // add to <Z>
            str[vtop] = -1;
            Q.push(vtop);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

            // Now Z is everything that can go to <vtop> avoiding <top>
            // And Y\Z is everything that must go via <top>

            // Set Y := everything to <vtop> not via <top>
            // Set Z := everything only to <vtop> via <top>

            Y.swap(Z);
            Y[vtop] = false; // but remove <vtop> again
            Z -= Y;
            Z[top] = true;

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1 and Z[str[v]]) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            std::string px = path;
            path += "-" + std::to_string(pr);
            changes |= search_rec(Z, top, player, Lower);
            path = px;
        }

        Z.reset();
    }

    return changes;
}